

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_hash_map.h
# Opt level: O3

bool __thiscall
crnlib::
hash_map<crn::block,_crnlib::empty_type,_crnlib::hasher<crn::block>,_crnlib::equal_to<crn::block>_>
::insert_no_grow(hash_map<crn::block,_crnlib::empty_type,_crnlib::hasher<crn::block>,_crnlib::equal_to<crn::block>_>
                 *this,insert_result *result,block *k,empty_type *v)

{
  raw_node *prVar1;
  uint32 uVar2;
  int iVar3;
  long lVar4;
  uint uVar5;
  uint uVar6;
  raw_node *__s1;
  uint uVar7;
  bool bVar8;
  
  if ((this->m_values).m_size == 0) {
    return false;
  }
  uVar2 = fast_hash(k,0x40);
  uVar6 = uVar2 * -0x61c88647 >> ((byte)this->m_hash_shift & 0x1f);
  prVar1 = (this->m_values).m_p;
  __s1 = prVar1 + uVar6;
  uVar7 = uVar6;
  if (prVar1[uVar6].m_bits[0x41] == '\0') {
LAB_0010701e:
    uVar6 = uVar7;
    if (this->m_grow_threshold <= this->m_num_valid) {
      return false;
    }
    lVar4 = 0;
    do {
      __s1->m_bits[lVar4 * 4] = k->m_c[lVar4].field_0.field_0.r;
      __s1->m_bits[lVar4 * 4 + 1] = k->m_c[lVar4].field_0.field_0.g;
      __s1->m_bits[lVar4 * 4 + 2] = k->m_c[lVar4].field_0.field_0.b;
      __s1->m_bits[lVar4 * 4 + 3] = k->m_c[lVar4].field_0.field_0.a;
      lVar4 = lVar4 + 1;
    } while (lVar4 != 0x10);
    *(empty_type *)(__s1->m_bits + 0x40) = *v;
    __s1->m_bits[0x41] = '\x01';
    this->m_num_valid = this->m_num_valid + 1;
    bVar8 = true;
  }
  else {
    iVar3 = bcmp(__s1,k,0x40);
    if (iVar3 == 0) {
      bVar8 = false;
    }
    else {
      uVar5 = (this->m_values).m_size - 1;
      do {
        bVar8 = uVar7 == 0;
        __s1 = __s1 + -1;
        uVar7 = uVar7 - 1;
        if (bVar8) {
          __s1 = prVar1 + uVar5;
          uVar7 = uVar5;
        }
        if (uVar6 == uVar7) {
          return false;
        }
        if (__s1->m_bits[0x41] == '\0') goto LAB_0010701e;
        iVar3 = bcmp(__s1,k,0x40);
      } while (iVar3 != 0);
      bVar8 = false;
      uVar6 = uVar7;
    }
  }
  (result->first).m_pTable = this;
  (result->first).m_index = uVar6;
  result->second = bVar8;
  return true;
}

Assistant:

inline bool insert_no_grow(insert_result& result, const Key& k, const Value& v = Value())
        {
            if (!m_values.size())
            {
                return false;
            }

            int index = hash_key(k);
            node* pNode = &get_node(index);

            if (pNode->state)
            {
                if (m_equals(pNode->first, k))
                {
                    result.first = iterator(*this, index);
                    result.second = false;
                    return true;
                }

                const int orig_index = index;

                for (;;)
                {
                    if (!index)
                    {
                        index = m_values.size() - 1;
                        pNode = &get_node(index);
                    }
                    else
                    {
                        index--;
                        pNode--;
                    }

                    if (orig_index == index)
                    {
                        return false;
                    }

                    if (!pNode->state)
                    {
                        break;
                    }

                    if (m_equals(pNode->first, k))
                    {
                        result.first = iterator(*this, index);
                        result.second = false;
                        return true;
                    }
                }
            }

            if (m_num_valid >= m_grow_threshold)
            {
                return false;
            }

            construct_value_type(pNode, k, v);

            pNode->state = cStateValid;

            m_num_valid++;
            CRNLIB_ASSERT(m_num_valid <= m_values.size());

            result.first = iterator(*this, index);
            result.second = true;

            return true;
        }